

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglwindow.cpp
# Opt level: O3

void __thiscall QXcbEglWindow::create(QXcbEglWindow *this)

{
  code *pcVar1;
  EGLSurface pvVar2;
  
  QXcbWindow::create();
  if (this->m_glIntegration->m_using_platform_display == true) {
    pcVar1 = (code *)eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT");
    pvVar2 = (EGLSurface)
             (*pcVar1)(this->m_glIntegration->m_egl_display,this->m_config,&this->field_0x40,0);
  }
  else {
    pvVar2 = (EGLSurface)
             eglCreateWindowSurface
                       (this->m_glIntegration->m_egl_display,this->m_config,
                        *(undefined4 *)&this->field_0x40,0);
  }
  this->m_surface = pvVar2;
  return;
}

Assistant:

void QXcbEglWindow::create()
{
    QXcbWindow::create();

    // this is always true without egl_x11
    if (m_glIntegration->usingPlatformDisplay()) {
        auto createPlatformWindowSurface = reinterpret_cast<PFNEGLCREATEPLATFORMWINDOWSURFACEEXTPROC>(
            eglGetProcAddress("eglCreatePlatformWindowSurfaceEXT"));
        m_surface = createPlatformWindowSurface(m_glIntegration->eglDisplay(),
                                                m_config,
                                                reinterpret_cast<void *>(&m_window),
                                                nullptr);
        return;
    }

#if QT_CONFIG(egl_x11)
    m_surface = eglCreateWindowSurface(m_glIntegration->eglDisplay(), m_config, m_window, nullptr);
#endif
}